

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall CGraphics_Threaded::InitWindow(CGraphics_Threaded *this)

{
  CConfig *pCVar1;
  int iVar2;
  
  iVar2 = IssueInit(this);
  while( true ) {
    if (iVar2 == 0) {
      return 0;
    }
    pCVar1 = this->m_pConfig;
    if (pCVar1->m_GfxFsaaSamples == 0) break;
    iVar2 = pCVar1->m_GfxFsaaSamples + -1;
    pCVar1->m_GfxFsaaSamples = iVar2;
    if (iVar2 == 0) {
      dbg_msg("gfx","disabling FSAA and trying again");
    }
    else {
      dbg_msg("gfx","lowering FSAA to %d and trying again");
    }
    iVar2 = IssueInit(this);
  }
  if ((pCVar1->m_GfxScreenWidth != 0x280) || (pCVar1->m_GfxScreenHeight != 0x1e0)) {
    dbg_msg("gfx","setting resolution to 640x480 and trying again");
    pCVar1 = this->m_pConfig;
    pCVar1->m_GfxScreenWidth = 0x280;
    pCVar1->m_GfxScreenHeight = 0x1e0;
    iVar2 = IssueInit(this);
    if (iVar2 == 0) {
      return 0;
    }
  }
  dbg_msg("gfx","out of ideas. failed to init graphics");
  return -1;
}

Assistant:

int CGraphics_Threaded::InitWindow()
{
	if(IssueInit() == 0)
		return 0;

	// try disabling fsaa
	while(m_pConfig->m_GfxFsaaSamples)
	{
		m_pConfig->m_GfxFsaaSamples--;

		if(m_pConfig->m_GfxFsaaSamples)
			dbg_msg("gfx", "lowering FSAA to %d and trying again", m_pConfig->m_GfxFsaaSamples);
		else
			dbg_msg("gfx", "disabling FSAA and trying again");

		if(IssueInit() == 0)
			return 0;
	}

	// try lowering the resolution
	if(m_pConfig->m_GfxScreenWidth != 640 || m_pConfig->m_GfxScreenHeight != 480)
	{
		dbg_msg("gfx", "setting resolution to 640x480 and trying again");
		m_pConfig->m_GfxScreenWidth = 640;
		m_pConfig->m_GfxScreenHeight = 480;

		if(IssueInit() == 0)
			return 0;
	}

	dbg_msg("gfx", "out of ideas. failed to init graphics");

	return -1;
}